

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_fwd.hpp
# Opt level: O0

future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
mxx::comm::irecv_str<char,std::char_traits<char>,std::allocator<char>>
          (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,comm *this,size_t size,int src,int tag)

{
  MPI_Comm poVar1;
  int iVar2;
  int iVar3;
  value_type *pvVar4;
  undefined8 uVar5;
  MPI_Datatype poVar6;
  MPI_Request *ppoVar7;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_f8;
  datatype local_c0;
  undefined1 local_a8 [8];
  datatype dt_1;
  datatype dt;
  undefined1 local_68 [8];
  future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> f
  ;
  int tag_local;
  int src_local;
  size_t size_local;
  comm *this_local;
  
  f.m_future.m_data._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = tag;
  f.m_future.m_data._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = src;
  if (-1 < src) {
    iVar3 = comm::size(this);
    if (src < iVar3) goto LAB_001114d1;
  }
  assert_fail("0 <= src && src < this->size()",
              "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/comm_fwd.hpp"
              ,0x26e,"irecv_str");
LAB_001114d1:
  future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  future_builder((future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_68);
  pvVar4 = future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::data((future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_68);
  std::__cxx11::string::resize((ulong)pvVar4);
  if (size < 0x7fffffff) {
    get_datatype<char>();
    future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::data((future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_68);
    uVar5 = std::__cxx11::string::front();
    poVar6 = mxx::datatype::type((datatype *)&dt_1.builtin);
    iVar2 = f.m_future.m_data._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_;
    iVar3 = (int)f.m_future.m_data._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    poVar1 = this->mpi_comm;
    ppoVar7 = future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::add_request((future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_68);
    MPI_Irecv(uVar5,size & 0xffffffff,poVar6,iVar2,iVar3,poVar1,ppoVar7);
    mxx::datatype::~datatype((datatype *)&dt_1.builtin);
  }
  else {
    get_datatype<char>();
    mxx::datatype::contiguous((datatype *)local_a8,&local_c0,size);
    mxx::datatype::~datatype(&local_c0);
    future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::data((future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_68);
    uVar5 = std::__cxx11::string::front();
    poVar6 = mxx::datatype::type((datatype *)local_a8);
    iVar2 = f.m_future.m_data._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_;
    iVar3 = (int)f.m_future.m_data._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    poVar1 = this->mpi_comm;
    ppoVar7 = future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::add_request((future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_68);
    MPI_Irecv(uVar5,1,poVar6,iVar2,iVar3,poVar1,ppoVar7);
    mxx::datatype::~datatype((datatype *)local_a8);
  }
  future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  get_future(&local_f8,
             (future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_68);
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::future
            (__return_storage_ptr__,&local_f8);
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~future
            (&local_f8);
  future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~future_builder((future_builder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_68);
  return __return_storage_ptr__;
}

Assistant:

inline mxx::future<std::basic_string<CharT, Traits, Alloc> > comm::irecv_str(size_t size, int src, int tag) const {
    MXX_ASSERT(0 <= src && src < this->size());
    mxx::future_builder<std::basic_string<CharT, Traits, Alloc> > f;
    f.data()->resize(size);
    if (size < mxx::max_int) {
        mxx::datatype dt = mxx::get_datatype<CharT>();
        MPI_Irecv(&(f.data()->front()), size, dt.type(), src, tag, this->mpi_comm, &f.add_request());
    } else {
        mxx::datatype dt = mxx::get_datatype<CharT>().contiguous(size);
        MPI_Irecv(&(f.data()->front()), 1, dt.type(), src, tag, this->mpi_comm, &f.add_request());
    }
    return std::move(f.get_future());
}